

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,dynamic_string_array *params,uint n,param_desc *pParam_desc)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  dynamic_string *pdVar8;
  ulong uVar9;
  dynamic_string *local_300;
  dynamic_string *local_280;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_240;
  undefined1 local_218 [8];
  param_value pv_1;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_1f8;
  undefined1 local_1d0 [8];
  param_value pv;
  undefined1 local_1b0 [4];
  uint v_1;
  dynamic_string filename;
  dynamic_string_array strings;
  uint v;
  uint num_val_strs;
  dynamic_string val_str [16];
  uint cMaxValues;
  param_desc *desc;
  uint local_68;
  uint param_index;
  char c;
  int modifier;
  undefined1 local_50 [8];
  dynamic_string key_str;
  dynamic_string *src_param;
  uint cur_arg_index;
  uint arg_index;
  param_desc *pParam_desc_local;
  uint n_local;
  dynamic_string_array *params_local;
  command_line_params *this_local;
  
  vector<crnlib::dynamic_string>::operator=(&this->m_params,params);
  src_param._4_4_ = 0;
  uVar5 = src_param._4_4_;
  while( true ) {
    while( true ) {
      do {
        src_param._4_4_ = uVar5;
        uVar1 = src_param._4_4_;
        uVar4 = vector<crnlib::dynamic_string>::size(params);
        if (uVar4 <= src_param._4_4_) {
          this_local._7_1_ = 1;
          goto LAB_001178e8;
        }
        uVar5 = src_param._4_4_ + 1;
        key_str.m_pStr = (char *)vector<crnlib::dynamic_string>::operator[](params,src_param._4_4_);
        bVar2 = dynamic_string::is_empty((dynamic_string *)key_str.m_pStr);
      } while (bVar2);
      cVar3 = dynamic_string::operator[]((dynamic_string *)key_str.m_pStr,0);
      if (cVar3 == '-') break;
      param_value::param_value((param_value *)local_218);
      vector<crnlib::dynamic_string>::push_back
                ((vector<crnlib::dynamic_string> *)local_218,(dynamic_string *)key_str.m_pStr);
      pdVar8 = vector<crnlib::dynamic_string>::back((vector<crnlib::dynamic_string> *)local_218);
      dynamic_string::unquote(pdVar8);
      pv_1.m_values.m_size = src_param._4_4_;
      std::make_pair<crnlib::dynamic_string&,crnlib::command_line_params::param_value&>
                (&local_240,(dynamic_string *)g_empty_dynamic_string,(param_value *)local_218);
      std::
      multimap<crnlib::dynamic_string,crnlib::command_line_params::param_value,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
      ::insert<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                ((multimap<crnlib::dynamic_string,crnlib::command_line_params::param_value,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                  *)&this->m_param_map,&local_240);
      std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::~pair(&local_240)
      ;
      param_value::~param_value((param_value *)local_218);
    }
    uVar4 = dynamic_string::get_len((dynamic_string *)key_str.m_pStr);
    if (uVar4 < 2) break;
    dynamic_string::dynamic_string((dynamic_string *)local_50,(dynamic_string *)key_str.m_pStr);
    dynamic_string::right((dynamic_string *)local_50,1);
    param_index = 0;
    uVar4 = dynamic_string::get_len((dynamic_string *)local_50);
    cVar3 = dynamic_string::operator[]((dynamic_string *)local_50,uVar4 - 1);
    if (cVar3 == '+') {
      param_index = 1;
    }
    else if (cVar3 == '-') {
      param_index = 0xffffffff;
    }
    if (param_index != 0) {
      uVar4 = dynamic_string::get_len((dynamic_string *)local_50);
      dynamic_string::left((dynamic_string *)local_50,uVar4 - 1);
    }
    local_68 = 0;
    while ((local_68 < n &&
           (bVar2 = dynamic_string::operator==
                              ((dynamic_string *)local_50,pParam_desc[local_68].m_pName), !bVar2)))
    {
      local_68 = local_68 + 1;
    }
    src_param._4_4_ = uVar5;
    if (local_68 == n) {
      pcVar7 = dynamic_string::get_ptr((dynamic_string *)key_str.m_pStr);
      console::error("Unrecognized command line parameter: \"%s\"",pcVar7);
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    else {
      local_280 = (dynamic_string *)&v;
      do {
        dynamic_string::dynamic_string(local_280);
        local_280 = local_280 + 1;
      } while (local_280 != (dynamic_string *)&val_str[0xf].m_pStr);
      strings.m_capacity = 0;
      if (pParam_desc[local_68].m_num_values == 0) {
LAB_00117467:
        vector<crnlib::dynamic_string>::vector((vector<crnlib::dynamic_string> *)&filename.m_pStr);
        if ((((pParam_desc[local_68].m_support_listing_file & 1U) == 0) ||
            (uVar4 = dynamic_string::get_len((dynamic_string *)&v), uVar4 < 2)) ||
           (cVar3 = dynamic_string::operator[]((dynamic_string *)&v,0), cVar3 != '@')) {
          pv.m_modifier = '\0';
          pv._21_3_ = 0;
          for (; (uint)pv._20_4_ < strings.m_capacity; pv._20_4_ = pv._20_4_ + 1) {
            dynamic_string::unquote((dynamic_string *)(&v + (ulong)(uint)pv._20_4_ * 4));
            vector<crnlib::dynamic_string>::push_back
                      ((vector<crnlib::dynamic_string> *)&filename.m_pStr,
                       (dynamic_string *)(&v + (ulong)(uint)pv._20_4_ * 4));
          }
LAB_0011762f:
          param_value::param_value((param_value *)local_1d0);
          vector<crnlib::dynamic_string>::swap
                    ((vector<crnlib::dynamic_string> *)local_1d0,
                     (vector<crnlib::dynamic_string> *)&filename.m_pStr);
          pv.m_values.m_size = uVar1;
          pv.m_values.m_capacity._0_1_ = (undefined1)param_index;
          std::make_pair<crnlib::dynamic_string&,crnlib::command_line_params::param_value&>
                    (&local_1f8,(dynamic_string *)local_50,(param_value *)local_1d0);
          pv_1._16_8_ = std::
                        multimap<crnlib::dynamic_string,crnlib::command_line_params::param_value,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                        ::
                        insert<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                                  ((multimap<crnlib::dynamic_string,crnlib::command_line_params::param_value,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                                    *)&this->m_param_map,&local_1f8);
          std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::~pair
                    (&local_1f8);
          param_value::~param_value((param_value *)local_1d0);
          bVar2 = false;
        }
        else {
          dynamic_string::dynamic_string((dynamic_string *)local_1b0,(dynamic_string *)&v);
          dynamic_string::right((dynamic_string *)local_1b0,1);
          dynamic_string::unquote((dynamic_string *)local_1b0);
          pcVar7 = dynamic_string::get_ptr((dynamic_string *)local_1b0);
          bVar2 = load_string_file(pcVar7,(dynamic_string_array *)&filename.m_pStr);
          if (!bVar2) {
            pcVar7 = dynamic_string::get_ptr((dynamic_string *)local_1b0);
            console::error("Failed loading listing file \"%s\"!",pcVar7);
            this_local._7_1_ = 0;
          }
          bVar2 = !bVar2;
          dynamic_string::~dynamic_string((dynamic_string *)local_1b0);
          if (!bVar2) goto LAB_0011762f;
        }
        vector<crnlib::dynamic_string>::~vector((vector<crnlib::dynamic_string> *)&filename.m_pStr);
      }
      else {
        uVar4 = pParam_desc[local_68].m_num_values;
        uVar6 = vector<crnlib::dynamic_string>::size(params);
        if (uVar5 + uVar4 <= uVar6) {
          for (strings.m_size = 0; strings.m_size < pParam_desc[local_68].m_num_values;
              strings.m_size = strings.m_size + 1) {
            pdVar8 = vector<crnlib::dynamic_string>::operator[](params,src_param._4_4_);
            uVar9 = (ulong)strings.m_capacity;
            strings.m_capacity = strings.m_capacity + 1;
            dynamic_string::operator=((dynamic_string *)(&v + uVar9 * 4),pdVar8);
            src_param._4_4_ = src_param._4_4_ + 1;
          }
          goto LAB_00117467;
        }
        uVar5 = pParam_desc[local_68].m_num_values;
        pcVar7 = dynamic_string::get_ptr((dynamic_string *)key_str.m_pStr);
        console::error("Expected %u value(s) after command line parameter: \"%s\"",(ulong)uVar5,
                       pcVar7);
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      local_300 = (dynamic_string *)&val_str[0xf].m_pStr;
      do {
        local_300 = local_300 + -1;
        dynamic_string::~dynamic_string(local_300);
      } while (local_300 != (dynamic_string *)&v);
    }
    dynamic_string::~dynamic_string((dynamic_string *)local_50);
    uVar5 = src_param._4_4_;
    if (bVar2) {
LAB_001178e8:
      return (bool)(this_local._7_1_ & 1);
    }
  }
  pcVar7 = dynamic_string::get_ptr((dynamic_string *)key_str.m_pStr);
  console::error("Invalid command line parameter: \"%s\"",pcVar7);
  this_local._7_1_ = 0;
  goto LAB_001178e8;
}

Assistant:

bool command_line_params::parse(const dynamic_string_array& params, uint n, const param_desc* pParam_desc)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        m_params = params;

        uint arg_index = 0;
        while (arg_index < params.size())
        {
            const uint cur_arg_index = arg_index;
            const dynamic_string& src_param = params[arg_index++];

            if (src_param.is_empty())
            {
                continue;
            }
#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
            if ((src_param[0] == '/') || (src_param[0] == '-'))
#else
            if (src_param[0] == '-')
#endif
            {
                if (src_param.get_len() < 2)
                {
                    console::error("Invalid command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                dynamic_string key_str(src_param);

                key_str.right(1);

                int modifier = 0;
                char c = key_str[key_str.get_len() - 1];
                if (c == '+')
                {
                    modifier = 1;
                }
                else if (c == '-')
                {
                    modifier = -1;
                }
                if (modifier)
                {
                    key_str.left(key_str.get_len() - 1);
                }
                uint param_index;
                for (param_index = 0; param_index < n; param_index++)
                {
                    if (key_str == pParam_desc[param_index].m_pName)
                    {
                        break;
                    }
                }

                if (param_index == n)
                {
                    console::error("Unrecognized command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                const param_desc& desc = pParam_desc[param_index];

                const uint cMaxValues = 16;
                dynamic_string val_str[cMaxValues];
                uint num_val_strs = 0;
                if (desc.m_num_values)
                {
                    CRNLIB_ASSERT(desc.m_num_values <= cMaxValues);

                    if ((arg_index + desc.m_num_values) > params.size())
                    {
                        console::error("Expected %u value(s) after command line parameter: \"%s\"", desc.m_num_values, src_param.get_ptr());
                        return false;
                    }

                    for (uint v = 0; v < desc.m_num_values; v++)
                    {
                        val_str[num_val_strs++] = params[arg_index++];
                    }
                }

                dynamic_string_array strings;

                if ((desc.m_support_listing_file) && (val_str[0].get_len() >= 2) && (val_str[0][0] == '@'))
                {
                    dynamic_string filename(val_str[0]);
                    filename.right(1);
                    filename.unquote();

                    if (!load_string_file(filename.get_ptr(), strings))
                    {
                        console::error("Failed loading listing file \"%s\"!", filename.get_ptr());
                        return false;
                    }
                }
                else
                {
                    for (uint v = 0; v < num_val_strs; v++)
                    {
                        val_str[v].unquote();
                        strings.push_back(val_str[v]);
                    }
                }

                param_value pv;
                pv.m_values.swap(strings);
                pv.m_index = cur_arg_index;
                pv.m_modifier = (int8)modifier;
                m_param_map.insert(std::make_pair(key_str, pv));
            }
            else
            {
                param_value pv;
                pv.m_values.push_back(src_param);
                pv.m_values.back().unquote();
                pv.m_index = cur_arg_index;
                m_param_map.insert(std::make_pair(g_empty_dynamic_string, pv));
            }
        }

        return true;
    }